

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateEnterExecutingMode(HelicsFederate fed,HelicsError *err)

{
  Federate *pFVar1;
  HelicsFederate in_RSI;
  Federate *fedObj;
  IterationRequest in_stack_00000067;
  Federate *in_stack_00000068;
  HelicsError *in_stack_ffffffffffffffe8;
  
  pFVar1 = getFed(in_RSI,in_stack_ffffffffffffffe8);
  if (pFVar1 != (Federate *)0x0) {
    helics::Federate::enterExecutingMode(in_stack_00000068,in_stack_00000067);
  }
  return;
}

Assistant:

void helicsFederateEnterExecutingMode(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        // printf("current state=%d\n", static_cast<int>(fedObj->getCurrentState()));
        fedObj->enterExecutingMode();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}